

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

XmlWriter * __thiscall Catch::XmlWriter::endElement(XmlWriter *this,XmlFormatting fmt)

{
  bool bVar1;
  ostream *poVar2;
  reference pvVar3;
  ostream *poVar4;
  XmlWriter *in_RDI;
  undefined8 in_stack_ffffffffffffffb8;
  XmlFormatting fmt_00;
  XmlWriter *this_00;
  string local_30 [48];
  
  fmt_00 = (XmlFormatting)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  this_00 = (XmlWriter *)&in_RDI->m_indent;
  std::__cxx11::string::size();
  std::__cxx11::string::substr((ulong)local_30,(ulong)this_00);
  std::__cxx11::string::operator=((string *)&in_RDI->m_indent,local_30);
  std::__cxx11::string::~string(local_30);
  if ((in_RDI->m_tagIsOpen & 1U) == 0) {
    newlineIfNecessary(this_00);
    bVar1 = anon_unknown_1::shouldIndent(None);
    if (bVar1) {
      std::operator<<(in_RDI->m_os,(string *)&in_RDI->m_indent);
    }
    poVar2 = std::operator<<(in_RDI->m_os,"</");
    pvVar3 = clara::std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)this_00);
    poVar4 = std::operator<<(poVar2,(string *)pvVar3);
    fmt_00 = (XmlFormatting)((ulong)poVar2 >> 0x20);
    std::operator<<(poVar4,">");
  }
  else {
    std::operator<<(in_RDI->m_os,"/>");
    in_RDI->m_tagIsOpen = false;
  }
  std::ostream::operator<<(in_RDI->m_os,std::flush<char,std::char_traits<char>>);
  applyFormatting(this_00,fmt_00);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::pop_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x13acfa);
  return in_RDI;
}

Assistant:

XmlWriter& XmlWriter::endElement(XmlFormatting fmt) {
        m_indent = m_indent.substr(0, m_indent.size() - 2);

        if( m_tagIsOpen ) {
            m_os << "/>";
            m_tagIsOpen = false;
        } else {
            newlineIfNecessary();
            if (shouldIndent(fmt)) {
                m_os << m_indent;
            }
            m_os << "</" << m_tags.back() << ">";
        }
        m_os << std::flush;
        applyFormatting(fmt);
        m_tags.pop_back();
        return *this;
    }